

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall CFFFileInput::ReadFDSelect(CFFFileInput *this,unsigned_short inFontIndex)

{
  ulong uVar1;
  FontDictInfo **ppFVar2;
  ushort local_52;
  ulong uStack_50;
  unsigned_short j;
  unsigned_long i_1;
  Byte fdIndex_1;
  unsigned_short nextRangeGlyphIndex;
  unsigned_short firstGlyphIndex;
  ulong uStack_40;
  unsigned_short rangesCount;
  unsigned_long i;
  EStatusCode local_30;
  Byte fdIndex;
  Byte format;
  EStatusCode status;
  unsigned_short glyphCount;
  LongFilePositionType fdSelectLocation;
  CFFFileInput *pCStack_18;
  unsigned_short inFontIndex_local;
  CFFFileInput *this_local;
  
  fdSelectLocation._6_2_ = inFontIndex;
  pCStack_18 = this;
  _status = GetFDSelectPosition(this,inFontIndex);
  _fdIndex = this->mCharStrings[fdSelectLocation._6_2_].mCharStringsCount;
  local_30 = eSuccess;
  if (_status == 0) {
    this_local._4_4_ = eFailure;
  }
  else {
    uVar1 = SUB168(ZEXT216(_fdIndex) * ZEXT816(8),0);
    if (SUB168(ZEXT216(_fdIndex) * ZEXT816(8),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    ppFVar2 = (FontDictInfo **)operator_new__(uVar1);
    this->mTopDictIndex[fdSelectLocation._6_2_].mFDSelect = ppFVar2;
    CFFPrimitiveReader::SetOffset(&this->mPrimitivesReader,_status);
    CFFPrimitiveReader::ReadCard8(&this->mPrimitivesReader,(Byte *)((long)&i + 7));
    if (i._7_1_ == '\0') {
      for (uStack_40 = 0; uStack_40 < _fdIndex && local_30 == eSuccess; uStack_40 = uStack_40 + 1) {
        local_30 = CFFPrimitiveReader::ReadCard8(&this->mPrimitivesReader,(Byte *)((long)&i + 6));
        if (local_30 != eFailure) {
          this->mTopDictIndex[fdSelectLocation._6_2_].mFDSelect[uStack_40] =
               this->mTopDictIndex[fdSelectLocation._6_2_].mFDArray + (int)(uint)i._6_1_;
        }
      }
    }
    else {
      local_30 = CFFPrimitiveReader::ReadCard16
                           (&this->mPrimitivesReader,(unsigned_short *)((long)&i_1 + 6));
      if (local_30 != eFailure) {
        local_30 = CFFPrimitiveReader::ReadCard16
                             (&this->mPrimitivesReader,(unsigned_short *)((long)&i_1 + 4));
        for (uStack_50 = 0; uStack_50 < i_1._6_2_ && local_30 == eSuccess; uStack_50 = uStack_50 + 1
            ) {
          CFFPrimitiveReader::ReadCard8(&this->mPrimitivesReader,(Byte *)((long)&i_1 + 1));
          CFFPrimitiveReader::ReadCard16
                    (&this->mPrimitivesReader,(unsigned_short *)((long)&i_1 + 2));
          local_30 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
          if (local_30 != eFailure) {
            for (local_52 = i_1._4_2_; local_52 < i_1._2_2_; local_52 = local_52 + 1) {
              this->mTopDictIndex[fdSelectLocation._6_2_].mFDSelect[local_52] =
                   this->mTopDictIndex[fdSelectLocation._6_2_].mFDArray + (int)(uint)i_1._1_1_;
            }
          }
          i_1._4_2_ = i_1._2_2_;
        }
      }
    }
    if (local_30 == eSuccess) {
      this_local._4_4_ = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
    }
    else {
      this_local._4_4_ = local_30;
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFFileInput::ReadFDSelect(unsigned short inFontIndex)
{
	LongFilePositionType fdSelectLocation = GetFDSelectPosition(inFontIndex);
	unsigned short glyphCount = mCharStrings[inFontIndex].mCharStringsCount;
	EStatusCode status = PDFHummus::eSuccess;
	Byte format;

	// supposed to get here only for CIDs. and they must have an FDSelect...so if it doesn't - fail
	if(0 == fdSelectLocation)
		return PDFHummus::eFailure;

	mTopDictIndex[inFontIndex].mFDSelect = new FontDictInfo*[glyphCount];
	mPrimitivesReader.SetOffset(fdSelectLocation);

	mPrimitivesReader.ReadCard8(format);
	if(0 == format)
	{
		Byte fdIndex;

		for(unsigned long i=0; i < glyphCount && PDFHummus::eSuccess == status; ++i)
		{
			status = mPrimitivesReader.ReadCard8(fdIndex);
			if(status != PDFHummus::eFailure)
				mTopDictIndex[inFontIndex].mFDSelect[i] = mTopDictIndex[inFontIndex].mFDArray+ fdIndex;
		}
	}
	else // format 3
	{
		unsigned short rangesCount;
		unsigned short firstGlyphIndex;
		unsigned short nextRangeGlyphIndex;
		Byte fdIndex;

		status = mPrimitivesReader.ReadCard16(rangesCount);
		if(status != PDFHummus::eFailure)
		{
			status = mPrimitivesReader.ReadCard16(firstGlyphIndex);
			for(unsigned long i=0; i < rangesCount && PDFHummus::eSuccess == status;++i)
			{
				mPrimitivesReader.ReadCard8(fdIndex);
				mPrimitivesReader.ReadCard16(nextRangeGlyphIndex);
				status = mPrimitivesReader.GetInternalState();
				if(status != PDFHummus::eFailure)
					for(unsigned short j=firstGlyphIndex; j < nextRangeGlyphIndex;++j)
						mTopDictIndex[inFontIndex].mFDSelect[j] = 
							mTopDictIndex[inFontIndex].mFDArray + fdIndex;
				firstGlyphIndex = nextRangeGlyphIndex;
			}
		}
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}